

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::selectionStmt(Parse *this)

{
  KeyWordTable *pKVar1;
  DelimiterTable *pDVar2;
  vector<QuadTuple,_std::allocator<QuadTuple>_> *pvVar3;
  int iVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  bool bVar8;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  QuadTuple local_4c8;
  int local_440;
  allocator local_439;
  int elseLine;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  QuadTuple local_3a0;
  byte local_313;
  byte local_312;
  allocator local_311;
  key_type local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  QuadTuple local_258;
  byte local_1cb;
  byte local_1ca;
  allocator local_1c9;
  key_type local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  QuadTuple local_108;
  byte local_7b;
  byte local_7a;
  allocator local_79;
  key_type local_78;
  int local_54;
  byte local_4d;
  int line;
  byte local_3a;
  allocator local_39;
  key_type local_38;
  Parse *local_18;
  Parse *this_local;
  
  local_18 = this;
  pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                     (this->tokenVec,(long)this->curIndex);
  local_3a = 0;
  local_4d = 0;
  bVar8 = false;
  if (pvVar5->type == KEYWORD) {
    pKVar1 = this->keyWordTable;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"if",&local_39);
    local_4d = 1;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pKVar1->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_38);
    iVar4 = *pmVar6;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar8 = iVar4 == pvVar5->id;
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (bVar8) {
    this->curIndex = this->curIndex + 1;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    local_54 = pvVar5->line;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    local_7a = 0;
    local_7b = 0;
    bVar8 = false;
    if (pvVar5->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      local_7a = 1;
      std::__cxx11::string::string((string *)&local_78,"(",&local_79);
      local_7b = 1;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_78);
      iVar4 = *pmVar6;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar8 = iVar4 == pvVar5->id;
    }
    if ((local_7b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    if ((local_7a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    if (!bVar8) {
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_219a8);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->line);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curIndex = this->curIndex + 1;
    pvVar3 = this->quadVec;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"if",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"__",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,"__",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"__",&local_1a1);
    QuadTuple::QuadTuple(&local_108,&local_128,&local_150,&local_178,&local_1a0);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar3,&local_108);
    QuadTuple::~QuadTuple(&local_108);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    iVar4 = expression(this);
    if (iVar4 == 0) {
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&pvVar5->name);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_219c0);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->line);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    local_1ca = 0;
    local_1cb = 0;
    bVar8 = false;
    if (pvVar5->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      local_1ca = 1;
      std::__cxx11::string::string((string *)&local_1c8,")",&local_1c9);
      local_1cb = 1;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_1c8);
      iVar4 = *pmVar6;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar8 = iVar4 == pvVar5->id;
    }
    if ((local_1cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    if (!bVar8) {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->curIndex);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&pvVar5->name);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_219cc);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->line);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curIndex = this->curIndex + 1;
    pvVar3 = this->quadVec;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"ifbegin",&local_279);
    std::__cxx11::string::string((string *)&local_2a0,(string *)&this->curTmpName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c0,"__",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,"__",&local_2e9);
    QuadTuple::QuadTuple(&local_258,&local_278,&local_2a0,&local_2c0,&local_2e8);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar3,&local_258);
    QuadTuple::~QuadTuple(&local_258);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    iVar4 = statement(this);
    if (iVar4 == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_219e4);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->line);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    local_312 = 0;
    local_313 = 0;
    bVar8 = false;
    if (pvVar5->type == KEYWORD) {
      pKVar1 = this->keyWordTable;
      std::allocator<char>::allocator();
      local_312 = 1;
      std::__cxx11::string::string((string *)&local_310,"else",&local_311);
      local_313 = 1;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pKVar1->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_310);
      iVar4 = *pmVar6;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar8 = iVar4 == pvVar5->id;
    }
    if ((local_313 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_310);
    }
    if ((local_312 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
    }
    if (bVar8) {
      pvVar3 = this->quadVec;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c0,"else",&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e8,"__",&local_3e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_410,"__",&local_411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&elseLine,"__",&local_439);
      QuadTuple::QuadTuple(&local_3a0,&local_3c0,&local_3e8,&local_410,(string *)&elseLine);
      std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar3,&local_3a0)
      ;
      QuadTuple::~QuadTuple(&local_3a0);
      std::__cxx11::string::~string((string *)&elseLine);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      this->curIndex = this->curIndex + 1;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      local_440 = pvVar5->line;
      iVar4 = statement(this);
      if (iVar4 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21a08);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_440);
        poVar7 = std::operator<<(poVar7,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    pvVar3 = this->quadVec;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e8,"ifend",&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"__",&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"__",&local_539);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_560,"__",&local_561);
    QuadTuple::QuadTuple(&local_4c8,&local_4e8,&local_510,&local_538,&local_560);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar3,&local_4c8);
    QuadTuple::~QuadTuple(&local_4c8);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::selectionStmt() {
    if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["if"] == tokenVec[curIndex].id) {
        curIndex++;
        int line = tokenVec[curIndex].line;
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["("] == tokenVec[curIndex].id) {
            curIndex++;
            quadVec.emplace_back(QuadTuple("if", "__", "__", "__"));
        } else {
            cout << "if语句缺少左括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(!expression()) {
            cout << tokenVec[curIndex].name << endl;
            cout << "if语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[")"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << curIndex << endl;
            cout << tokenVec[curIndex].name  << endl;
            cout << "if语句缺少右括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        quadVec.emplace_back(QuadTuple("ifbegin", curTmpName, "__", "__"));
        //sem.pop();
        if(!statement()) {
            cout << "statement语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["else"] == tokenVec[curIndex].id) {
            quadVec.emplace_back(QuadTuple("else", "__", "__", "__"));
            curIndex++;
            int elseLine = tokenVec[curIndex].line;
            if(!statement()) {
                cout << "else 语句表达式错误在第"  << elseLine << "行" << endl;
                exit(0);
            }
        }
        quadVec.emplace_back(QuadTuple("ifend", "__", "__", "__"));
        return 1;
    }
    return 0;
}